

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::elem<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  optional<wasm::Expression_*> offset_00;
  Name NVar1;
  Name NVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  size_t i;
  Expression **ppEVar7;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar8;
  Err *pEVar9;
  Name *pNVar10;
  bool bVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  Ok local_4b1;
  Err local_4b0;
  Err *local_490;
  Err *err_6;
  _Storage<wasm::Expression_*,_true> _Stack_480;
  size_t local_478;
  char *pcStack_470;
  undefined1 local_468 [8];
  Result<wasm::Ok> _val_6;
  Err *err_5;
  undefined1 local_408 [8];
  Result<wasm::Ok> _val_5;
  string local_3d8;
  Err local_3b8;
  Err local_398;
  Err *local_378;
  Err *err_4;
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> _val_4;
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> elems;
  undefined1 local_318 [6];
  bool legacy;
  Err local_2f8;
  _Storage<wasm::Expression_*,_true> local_2d8;
  _Storage<wasm::Expression_*,_true> local_2d0;
  Err local_2c8;
  Err *local_2a8;
  Err *err_3;
  Result<wasm::Expression_*> _val_3;
  Result<wasm::Expression_*> off_1;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  MaybeResult<wasm::Ok> inst;
  size_t beforeLParen;
  _Storage<wasm::Expression_*,_true> local_1c8;
  Err local_1c0;
  Err *local_1a0;
  Err *err_1;
  Result<wasm::Expression_*> _val_1;
  Result<wasm::Expression_*> off;
  Err local_130;
  Err *local_110;
  Err *err;
  MaybeResult<wasm::Name> _val;
  _Storage<wasm::Expression_*,_true> _Stack_98;
  optional<wasm::Expression_*> offset;
  MaybeResult<wasm::Name> table;
  undefined1 local_58 [7];
  bool isDeclare;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseDefsCtx *ctx_local;
  
  sVar6 = Lexer::getPos(&ctx->in);
  bVar12 = sv("elem",4);
  bVar4 = Lexer::takeSExprStart(&ctx->in,bVar12);
  if (!bVar4) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)local_58,&ctx->in);
  bVar4 = std::optional::operator_cast_to_bool((optional *)local_58);
  if (bVar4) {
    pNVar10 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_58);
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar10);
  }
  bVar4 = false;
  MaybeResult<wasm::Name>::MaybeResult
            ((MaybeResult<wasm::Name> *)
             &offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Expression_*>._M_engaged);
  std::optional<wasm::Expression_*>::optional((optional<wasm::Expression_*> *)&_Stack_98);
  bVar12 = sv("declare",7);
  bVar5 = Lexer::takeKeyword(&ctx->in,bVar12);
  if (bVar5) {
    bVar4 = true;
  }
  else {
    maybeTableuse<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),ctx);
    MaybeResult<wasm::Name>::operator=
              ((MaybeResult<wasm::Name> *)
               &offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Expression_*>._M_engaged,
               (MaybeResult<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    MaybeResult<wasm::Name>::~MaybeResult
              ((MaybeResult<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    MaybeResult<wasm::Name>::MaybeResult
              ((MaybeResult<wasm::Name> *)&err,
               (MaybeResult<wasm::Name> *)
               &offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Expression_*>._M_engaged);
    local_110 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)&err);
    bVar5 = local_110 != (Err *)0x0;
    if (bVar5) {
      wasm::Err::Err(&local_130,local_110);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)&err);
    if (bVar5) goto LAB_02484494;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&off.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),"offset");
    bVar5 = Lexer::takeSExprStart(&ctx->in,stack0xfffffffffffffeb8);
    if (bVar5) {
      expr<wasm::WATParser::ParseDefsCtx>
                ((Result<wasm::Expression_*> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx);
      Result<wasm::Expression_*>::Result
                ((Result<wasm::Expression_*> *)&err_1,
                 (Result<wasm::Expression_*> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      local_1a0 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err_1);
      bVar5 = local_1a0 != (Err *)0x0;
      if (bVar5) {
        wasm::Err::Err(&local_1c0,local_1a0);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1c0);
        wasm::Err::~Err(&local_1c0);
      }
      Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err_1);
      if (!bVar5) {
        ppEVar7 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        std::optional<wasm::Expression_*>::optional<wasm::Expression_*&,_true>
                  ((optional<wasm::Expression_*> *)&beforeLParen,ppEVar7);
        _Stack_98 = (_Storage<wasm::Expression_*,_true>)beforeLParen;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_payload = local_1c8;
      }
      Result<wasm::Expression_*>::~Result
                ((Result<wasm::Expression_*> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      if (bVar5 && bVar5) goto LAB_02484494;
    }
    else {
      i = Lexer::getPos(&ctx->in);
      bVar5 = Lexer::takeLParen(&ctx->in);
      if (bVar5) {
        instr<wasm::WATParser::ParseDefsCtx>
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
        bVar5 = wasm::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar5) {
          MaybeResult<wasm::Ok>::MaybeResult
                    ((MaybeResult<wasm::Ok> *)&err_2,
                     (MaybeResult<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          pEVar9 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
          bVar5 = pEVar9 != (Err *)0x0;
          if (bVar5) {
            wasm::Err::Err((Err *)((long)&off_1.val.
                                          super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                  0x20),pEVar9);
            MaybeResult<wasm::Ok>::MaybeResult
                      (__return_storage_ptr__,
                       (Err *)((long)&off_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20))
            ;
            wasm::Err::~Err((Err *)((long)&off_1.val.
                                           super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                   0x20));
          }
          MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
          if (!bVar5) {
            ParseDefsCtx::makeExpr
                      ((Result<wasm::Expression_*> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx);
            Result<wasm::Expression_*>::Result
                      ((Result<wasm::Expression_*> *)&err_3,
                       (Result<wasm::Expression_*> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
            local_2a8 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err_3);
            bVar11 = local_2a8 != (Err *)0x0;
            if (bVar11) {
              wasm::Err::Err(&local_2c8,local_2a8);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2c8);
              wasm::Err::~Err(&local_2c8);
            }
            Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err_3);
            if (!bVar11) {
              ppEVar7 = Result<wasm::Expression_*>::operator*
                                  ((Result<wasm::Expression_*> *)
                                   ((long)&_val_3.val.
                                           super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                   0x20));
              std::optional<wasm::Expression_*>::optional<wasm::Expression_*&,_true>
                        ((optional<wasm::Expression_*> *)&local_2d8,ppEVar7);
              _Stack_98 = local_2d8;
              offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Expression_*>._M_payload = local_2d0;
            }
            bVar3 = bVar11;
            bVar5 = bVar3 && bVar11;
            Result<wasm::Expression_*>::~Result
                      ((Result<wasm::Expression_*> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
            if (!bVar3 || !bVar11) goto LAB_02483df2;
          }
        }
        else {
          Lexer::setPos(&ctx->in,i);
LAB_02483df2:
          bVar5 = false;
        }
        MaybeResult<wasm::Ok>::~MaybeResult
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar5) goto LAB_02484494;
      }
    }
    bVar5 = std::optional::operator_cast_to_bool((optional *)&_Stack_98);
    if ((bVar5) && (bVar5 = Lexer::takeRParen(&ctx->in), !bVar5)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_318,"expected end of offset expression",
                 (allocator<char> *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x27))
      ;
      Lexer::err(&local_2f8,&ctx->in,(string *)local_318);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2f8);
      wasm::Err::~Err(&local_2f8);
      std::__cxx11::string::~string((string *)local_318);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x27))
      ;
      goto LAB_02484494;
    }
  }
  bVar5 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     &offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Expression_*>._M_engaged);
  elems.val.
  super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
  super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
  super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
  super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
  super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._38_1_ = !bVar5;
  elemlist<wasm::WATParser::ParseDefsCtx>
            ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)
             ((long)&_val_4.val.
                     super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20),ctx,
             (bool)elems.val.
                   super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._38_1_);
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::Result
            ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)&err_4
             ,(Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)
              ((long)&_val_4.val.
                      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20));
  local_378 = Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::getErr
                        ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          *)&err_4);
  bVar5 = local_378 == (Err *)0x0;
  if (!bVar5) {
    wasm::Err::Err(&local_398,local_378);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_398);
    wasm::Err::~Err(&local_398);
  }
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::~Result
            ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)&err_4
            );
  if (bVar5) {
    bVar5 = Lexer::takeRParen(&ctx->in);
    if (bVar5) {
      local_20 = (Index)sVar6;
      if (bVar4) {
        pvVar8 = Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::
                 operator*((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                            *)((long)&_val_4.val.
                                      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                              + 0x20));
        NVar2.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        NVar2.super_IString.str._M_len =
             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_;
        ParseDefsCtx::addDeclareElem((Result<wasm::Ok> *)local_408,ctx,NVar2,pvVar8,local_20);
        pEVar9 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_408);
        bVar4 = pEVar9 == (Err *)0x0;
        if (!bVar4) {
          wasm::Err::Err((Err *)((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar9);
          MaybeResult<wasm::Ok>::MaybeResult
                    (__return_storage_ptr__,
                     (Err *)((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_408);
      }
      else {
        local_478 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._16_8_;
        pcStack_470 = (char *)name.super_IString.str._M_len;
        pNVar10 = MaybeResult<wasm::Name>::getPtr
                            ((MaybeResult<wasm::Name> *)
                             &offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload
                              .super__Optional_payload_base<wasm::Expression_*>._M_engaged);
        err_6 = (Err *)_Stack_98._M_value;
        _Stack_480 = offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Expression_*>._M_payload;
        pvVar8 = Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::
                 operator*((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                            *)((long)&_val_4.val.
                                      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                              + 0x20));
        NVar1.super_IString.str._M_str = pcStack_470;
        NVar1.super_IString.str._M_len = local_478;
        offset_00.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._8_8_ = _Stack_480._M_value;
        offset_00.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_payload._M_value = (Expression *)err_6;
        ParseDefsCtx::addElem
                  ((Result<wasm::Ok> *)local_468,ctx,NVar1,pNVar10,offset_00,pvVar8,local_20);
        local_490 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_468);
        bVar4 = local_490 == (Err *)0x0;
        if (!bVar4) {
          wasm::Err::Err(&local_4b0,local_490);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_4b0);
          wasm::Err::~Err(&local_4b0);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_468);
      }
      if (bVar4) {
        MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_4b1);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"expected end of element segment",
                 (allocator<char> *)
                 ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      Lexer::err(&local_3b8,&ctx->in,&local_3d8);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3b8);
      wasm::Err::~Err(&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    }
  }
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::~Result
            ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)
             ((long)&_val_4.val.
                     super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20));
LAB_02484494:
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             &offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Expression_*>._M_engaged);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> elem(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("elem"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  bool isDeclare = false;
  MaybeResult<typename Ctx::TableIdxT> table;
  std::optional<typename Ctx::ExprT> offset;

  if (ctx.in.takeKeyword("declare"sv)) {
    isDeclare = true;
  } else {
    table = maybeTableuse(ctx);
    CHECK_ERR(table);

    if (ctx.in.takeSExprStart("offset")) {
      auto off = expr(ctx);
      CHECK_ERR(off);
      offset = *off;
    } else {
      // This may be an abbreviated offset instruction or it may be the
      // beginning of the elemlist.
      auto beforeLParen = ctx.in.getPos();
      if (ctx.in.takeLParen()) {
        if (auto inst = instr(ctx)) {
          CHECK_ERR(inst);
          auto off = ctx.makeExpr();
          CHECK_ERR(off);
          offset = *off;
        } else {
          // This must be the beginning of the elemlist instead.
          ctx.in.setPos(beforeLParen);
        }
      }
    }
    if (offset && !ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
  }

  // If there is no explicit tableuse, we can use the legacy elemlist format.
  bool legacy = !table;
  auto elems = elemlist(ctx, legacy);
  CHECK_ERR(elems);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of element segment");
  }

  if (isDeclare) {
    CHECK_ERR(ctx.addDeclareElem(name, std::move(*elems), pos));
  } else {
    CHECK_ERR(
      ctx.addElem(name, table.getPtr(), offset, std::move(*elems), pos));
  }

  return Ok{};
}